

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.c
# Opt level: O1

int mbedtls_sha512_self_test(int verbose)

{
  uchar *input;
  long lVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  mbedtls_sha512_context ctx;
  uchar sha512sum [64];
  mbedtls_sha512_context local_158;
  uchar local_78 [72];
  
  input = (uchar *)calloc(0x400,1);
  if (input == (uchar *)0x0) {
    iVar2 = 1;
    if (verbose != 0) {
      puts("Buffer allocation failed");
    }
  }
  else {
    memset(&local_158,0,0xd8);
    uVar4 = 0;
    do {
      uVar3 = (int)uVar4 + (int)((uVar4 & 0xffffffff) / 3) * -3;
      if (verbose != 0) {
        printf("  SHA-%d test #%d: ",(ulong)((uint)(2 < uVar4) * 0x80 + 0x180),(ulong)(uVar3 + 1));
      }
      local_158.total[0] = 0;
      local_158.total[1] = 0;
      if (uVar4 < 3) {
        local_158.state[0] = 0xcbbb9d5dc1059ed8;
        local_158.state[1] = 0x629a292a367cd507;
        local_158.state[2] = 0x9159015a3070dd17;
        local_158.state[3] = 0x152fecd8f70e5939;
        local_158.state[4] = 0x67332667ffc00b31;
        local_158.state[5] = 0x8eb44a8768581511;
        local_158.state[6] = 0xdb0c2e0d64f98fa7;
        local_158.state[7] = 0x47b5481dbefa4fa4;
      }
      else {
        local_158.state[0] = 0x6a09e667f3bcc908;
        local_158.state[1] = 0xbb67ae8584caa73b;
        local_158.state[2] = 0x3c6ef372fe94f82b;
        local_158.state[3] = 0xa54ff53a5f1d36f1;
        local_158.state[4] = 0x510e527fade682d1;
        local_158.state[5] = 0x9b05688c2b3e6c1f;
        local_158.state[6] = 0x1f83d9abfb41bd6b;
        local_158.state[7] = 0x5be0cd19137e2179;
      }
      local_158.is384 = (int)(uVar4 < 3);
      if (uVar3 == 2) {
        memset(input,0x61,1000);
        iVar2 = 1000;
        do {
          mbedtls_sha512_update_ret(&local_158,input,1000);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      else {
        mbedtls_sha512_update_ret(&local_158,sha512_test_buf[uVar3],sha512_test_buflen[uVar3]);
      }
      mbedtls_sha512_finish_ret(&local_158,local_78);
      iVar2 = bcmp(local_78,sha512_test_sum + uVar4,(ulong)(2 < uVar4) * 0x10 + 0x30);
      if (iVar2 != 0) {
        iVar2 = 1;
        if (verbose != 0) {
          puts("failed");
        }
        goto LAB_0013b6a4;
      }
      if (verbose != 0) {
        puts("passed");
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 6);
    iVar2 = 0;
    if (verbose != 0) {
      putchar(10);
      iVar2 = 0;
    }
LAB_0013b6a4:
    lVar1 = 0;
    do {
      *(undefined1 *)((long)local_158.total + lVar1) = 0;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0xd8);
    free(input);
  }
  return iVar2;
}

Assistant:

int mbedtls_sha512_self_test( int verbose )
{
    int i, j, k, buflen, ret = 0;
    unsigned char *buf;
    unsigned char sha512sum[64];
    mbedtls_sha512_context ctx;

    buf = mbedtls_calloc( 1024, sizeof(unsigned char) );
    if( NULL == buf )
    {
        if( verbose != 0 )
            mbedtls_printf( "Buffer allocation failed\n" );

        return( 1 );
    }

    mbedtls_sha512_init( &ctx );

    for( i = 0; i < 6; i++ )
    {
        j = i % 3;
        k = i < 3;

        if( verbose != 0 )
            mbedtls_printf( "  SHA-%d test #%d: ", 512 - k * 128, j + 1 );

        if( ( ret = mbedtls_sha512_starts_ret( &ctx, k ) ) != 0 )
            goto fail;

        if( j == 2 )
        {
            memset( buf, 'a', buflen = 1000 );

            for( j = 0; j < 1000; j++ )
            {
                ret = mbedtls_sha512_update_ret( &ctx, buf, buflen );
                if( ret != 0 )
                    goto fail;
            }
        }
        else
        {
            ret = mbedtls_sha512_update_ret( &ctx, sha512_test_buf[j],
                                             sha512_test_buflen[j] );
            if( ret != 0 )
                goto fail;
        }

        if( ( ret = mbedtls_sha512_finish_ret( &ctx, sha512sum ) ) != 0 )
            goto fail;

        if( memcmp( sha512sum, sha512_test_sum[i], 64 - k * 16 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    goto exit;

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

exit:
    mbedtls_sha512_free( &ctx );
    mbedtls_free( buf );

    return( ret );
}